

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd64.cpp
# Opt level: O0

void stackjit::Amd64Backend::addIntToReg(CodeGen *codeGen,ExtendedRegisters destReg,int srcValue)

{
  ulong local_28;
  size_t i;
  IntToBytes converter;
  ExtendedRegisters local_11;
  int srcValue_local;
  ExtendedRegisters destReg_local;
  CodeGen *codeGen_local;
  
  i._7_1_ = 0x49;
  converter.intValue = srcValue;
  local_11 = destReg;
  _srcValue_local = codeGen;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (codeGen,(value_type_conflict1 *)((long)&i + 7));
  i._6_1_ = 0x81;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (_srcValue_local,(value_type_conflict1 *)((long)&i + 6));
  i._5_1_ = local_11 | 0xc0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (_srcValue_local,(value_type_conflict1 *)((long)&i + 5));
  i._0_4_ = converter;
  for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (_srcValue_local,(value_type_conflict1 *)((long)&i + local_28));
  }
  return;
}

Assistant:

void Amd64Backend::addIntToReg(CodeGen& codeGen, ExtendedRegisters destReg, int srcValue) {
		codeGen.push_back(0x49);
		codeGen.push_back(0x81);
		codeGen.push_back(0xc0 | (Byte)destReg);

		IntToBytes converter;
		converter.intValue = srcValue;

		for (std::size_t i = 0; i < sizeof(int); i++) {
			codeGen.push_back(converter.byteValues[i]);
		}
	}